

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::hugeint_t,_duckdb::hugeint_t,_bool,_duckdb::BinarySingleArgumentOperatorWrapper,_duckdb::GreaterThan,_bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  hugeint_t right_00;
  hugeint_t left_00;
  bool bVar1;
  bool bVar2;
  hugeint_t *phVar3;
  hugeint_t *idx;
  bool *pbVar4;
  byte in_CL;
  Vector *in_RDX;
  Vector *in_RSI;
  bool *result_data;
  hugeint_t *rdata;
  hugeint_t *ldata;
  uint64_t uVar5;
  int64_t iVar6;
  uint64_t uVar7;
  int64_t iVar8;
  undefined8 in_stack_ffffffffffffffc8;
  Vector *in_stack_ffffffffffffffd0;
  
  bVar1 = (bool)(in_CL & 1);
  Vector::SetVectorType
            (in_stack_ffffffffffffffd0,(VectorType)((ulong)in_stack_ffffffffffffffc8 >> 0x38));
  phVar3 = ConstantVector::GetData<duckdb::hugeint_t>((Vector *)0x2d1c744);
  idx = ConstantVector::GetData<duckdb::hugeint_t>((Vector *)0x2d1c753);
  pbVar4 = ConstantVector::GetData<bool>((Vector *)0x2d1c762);
  bVar2 = ConstantVector::IsNull((Vector *)0x2d1c771);
  if ((!bVar2) && (bVar2 = ConstantVector::IsNull((Vector *)0x2d1c77f), !bVar2)) {
    uVar7 = phVar3->lower;
    iVar8 = phVar3->upper;
    uVar5 = idx->lower;
    iVar6 = idx->upper;
    ConstantVector::Validity(in_RDX);
    left_00.upper = iVar8;
    left_00.lower = uVar7;
    right_00.upper = iVar6;
    right_00.lower = uVar5;
    bVar1 = BinarySingleArgumentOperatorWrapper::
            Operation<bool,_duckdb::GreaterThan,_duckdb::hugeint_t,_duckdb::hugeint_t,_bool>
                      (bVar1,left_00,right_00,(ValidityMask *)0x0,(idx_t)idx);
    *pbVar4 = bVar1;
    return;
  }
  ConstantVector::SetNull(in_RSI,SUB81((ulong)in_RDX >> 0x38,0));
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}